

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O2

char * off_msg_str(obj *otmp,boolean delayed,boolean deliberate)

{
  int iVar1;
  flag *in_RAX;
  undefined4 extraout_var;
  char *pcVar2;
  char *pcVar3;
  
  if ((otmp != (obj *)0x0) && (in_RAX = &flags, flags.verbose != '\0')) {
    pcVar2 = "finish taking off";
    if (delayed == '\0') {
      pcVar2 = "take off";
    }
    pcVar3 = "were wearing";
    if (deliberate != '\0') {
      pcVar3 = pcVar2;
    }
    pcVar2 = doname(otmp);
    iVar1 = snprintf(off_msg_str::buf,0x100,"You %s %s.",pcVar3,pcVar2);
    return (char *)CONCAT44(extraout_var,iVar1);
  }
  off_msg_str::buf[0] = '\0';
  return &in_RAX->autodig;
}

Assistant:

static const char *off_msg_str(const struct obj *otmp,
			       boolean delayed, boolean deliberate)
{
	static char buf[BUFSZ];

	if (otmp && flags.verbose) {
	    snprintf(buf, BUFSZ, "You %s %s.",
		     !deliberate ? "were wearing" :
		     delayed ? "finish taking off" : "take off",
		     doname(otmp));
	} else {
	    buf[0] = '\0';
	}

	return buf;
}